

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecuteProcessCommand.cxx
# Opt level: O0

void anon_unknown.dwarf_2fe0bb::cmExecuteProcessCommandAppend
               (vector<char,_std::allocator<char>_> *output,char *data,size_t length)

{
  size_t length_local;
  char *data_local;
  vector<char,_std::allocator<char>_> *output_local;
  
  ::cm::append<std::vector<char,_std::allocator<char>_>,_const_char_*,_0>(output,data,data + length)
  ;
  return;
}

Assistant:

void cmExecuteProcessCommandAppend(std::vector<char>& output, const char* data,
                                   std::size_t length)
{
#if defined(__APPLE__)
  // HACK on Apple to work around bug with inserting at the
  // end of an empty vector.  This resulted in random failures
  // that were hard to reproduce.
  if (output.empty() && length > 0) {
    output.push_back(data[0]);
    ++data;
    --length;
  }
#endif
  cm::append(output, data, data + length);
}